

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O1

void dg::llvmdg::LLVMSlicer::adjustBBlocksSucessors(LLVMDependenceGraph *graph,uint32_t slice_id)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  BBlock<dg::LLVMNode> *this;
  size_t sVar3;
  BBlock<dg::LLVMNode> *pBVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  _Link_type p_Var11;
  LLVMBBlock *pLVar12;
  _List_node_base *p_Var13;
  LLVMBBlock *pLVar14;
  _Rb_tree_node_base *p_Var15;
  _Link_type p_Var16;
  byte bVar17;
  DGContainer<unsigned_char,_8U> labels;
  BBlockEdge local_90;
  LLVMBBlock *local_80;
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
  *local_78;
  _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
  local_70;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var15 = *(_Rb_tree_node_base **)(graph + 0x78);
  local_38 = (_Rb_tree_node_base *)(graph + 0x68);
  if (p_Var15 == local_38) {
    pLVar12 = (LLVMBBlock *)0x0;
  }
  else {
    local_80 = *(LLVMBBlock **)(graph + 0x98);
    p_Var1 = &local_70._M_impl.super__Rb_tree_header;
    pLVar12 = (LLVMBBlock *)0x0;
    do {
      llvm::BasicBlock::getTerminator();
      this = (BBlock<dg::LLVMNode> *)p_Var15[1]._M_parent;
      sVar3 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (sVar3 != 0) {
        if (((sVar3 == 2) &&
            (*(uint32_t *)
              &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
               _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[0x1c]._M_prev != slice_id))
           && (bVar6 = BBlock<dg::LLVMNode>::successorsAreSame(this), !bVar6)) {
          p_Var2 = &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
          for (p_Var10 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              ((_Rb_tree_header *)p_Var10 != p_Var2 &&
              (*(BBlock<dg::LLVMNode> **)(p_Var10 + 1) != this));
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          }
          if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
             (uVar7 = BBlock<dg::LLVMNode>::removeSuccessorsTarget(this,this), uVar7 == 0)) {
            abort();
          }
        }
        if (((this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
           (*(uint32_t *)
             &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
              _M_impl._M_node.super__List_node_base._M_prev[1]._M_next[0x1c]._M_prev != slice_id)) {
          pLVar14 = *(LLVMBBlock **)
                     ((this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     + 1);
          if ((pLVar14 == local_80) && (pLVar14 = pLVar12, pLVar12 == (LLVMBBlock *)0x0)) {
            pLVar14 = createNewExitBB(graph);
            *(LLVMBBlock **)(graph + 0x98) = pLVar14;
            if ((pLVar14->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&pLVar14->nodes)
            {
              p_Var13 = (_List_node_base *)0x0;
            }
            else {
              p_Var13 = (pLVar14->nodes).
                        super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                        _M_node.super__List_node_base._M_prev[1]._M_next;
            }
            *(_List_node_base **)(graph + 0x20) = p_Var13;
            pLVar12 = pLVar14;
          }
          BBlock<dg::LLVMNode>::removeSuccessors(this);
          local_70._M_impl.super__Rb_tree_header._M_header._M_color =
               local_70._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
          local_70._M_impl._0_8_ = pLVar14;
          std::
          _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
          ::_M_insert_unique<dg::BBlock<dg::LLVMNode>::BBlockEdge_const&>
                    ((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                      *)&this->nextBBs,(BBlockEdge *)&local_70);
          local_70._M_impl._0_8_ = this;
          std::
          _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
          ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                    ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                      *)&pLVar14->prevBBs,(BBlock<dg::LLVMNode> **)&local_70);
        }
        else {
          local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
          p_Var10 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          local_40 = p_Var15;
          for (; (_Rb_tree_header *)p_Var10 !=
                 &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
            if ((*(char *)&p_Var10[1]._M_parent != -1) &&
               (*(LLVMBBlock **)(p_Var10 + 1) != local_80)) {
              uVar5 = (ulong)local_90.target >> 8;
              local_90.target =
                   (BBlock<dg::LLVMNode> *)CONCAT71((int7)uVar5,*(char *)&p_Var10[1]._M_parent);
              std::
              _Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
              ::_M_insert_unique<unsigned_char_const&>
                        ((_Rb_tree<unsigned_char,unsigned_char,std::_Identity<unsigned_char>,std::less<unsigned_char>,std::allocator<unsigned_char>>
                          *)&local_70,(uchar *)&local_90);
            }
          }
          local_78 = (_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                      *)&this->nextBBs;
          iVar8 = llvm::Instruction::getNumSuccessors();
          if (iVar8 != 0) {
            uVar7 = 0;
            do {
              bVar17 = (byte)uVar7;
              p_Var11 = (_Link_type)p_Var1;
              for (p_Var16 = (_Link_type)local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var16 != (_Link_type)0x0;
                  p_Var16 = *(_Link_type *)(&p_Var16->_M_storage + (ulong)bVar6 * 8 + -0x10)) {
                bVar6 = (byte)*(size_t *)(p_Var16->_M_storage)._M_storage < bVar17;
                if (!bVar6) {
                  p_Var11 = p_Var16;
                }
              }
              p_Var16 = (_Link_type)p_Var1;
              if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
                 (p_Var16 = p_Var11, bVar17 < (byte)*(size_t *)(p_Var11->_M_storage)._M_storage)) {
                p_Var16 = (_Link_type)p_Var1;
              }
              if ((_Rb_tree_header *)p_Var16 == p_Var1) {
                if (pLVar12 == (LLVMBBlock *)0x0) {
                  pLVar12 = createNewExitBB(graph);
                  *(LLVMBBlock **)(graph + 0x98) = pLVar12;
                  if ((pLVar12->nodes).
                      super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
                      _M_node.super__List_node_base._M_next == (_List_node_base *)&pLVar12->nodes) {
                    p_Var13 = (_List_node_base *)0x0;
                  }
                  else {
                    p_Var13 = (pLVar12->nodes).
                              super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
                              _M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
                  }
                  *(_List_node_base **)(graph + 0x20) = p_Var13;
                }
                local_90.target = pLVar12;
                local_90.label = bVar17;
                std::
                _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
                ::_M_insert_unique<dg::BBlock<dg::LLVMNode>::BBlockEdge_const&>(local_78,&local_90);
                local_90.target = this;
                std::
                _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                          ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                            *)&pLVar12->prevBBs,&local_90.target);
              }
              uVar7 = uVar7 + 1;
              uVar9 = llvm::Instruction::getNumSuccessors();
            } while (uVar7 < uVar9);
          }
          if (pLVar12 != (LLVMBBlock *)0x0) {
            BBlock<dg::LLVMNode>::removeSuccessorsTarget(this,local_80);
          }
          p_Var15 = local_40;
          if ((1 < (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
             (bVar6 = BBlock<dg::LLVMNode>::successorsAreSame(this), bVar6)) {
            pBVar4 = *(BBlock<dg::LLVMNode> **)
                      ((this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left + 1);
            BBlock<dg::LLVMNode>::removeSuccessors(this);
            local_90.label = 0;
            local_90.target = pBVar4;
            std::
            _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,dg::BBlock<dg::LLVMNode>::BBlockEdge,std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>>
            ::_M_insert_unique<dg::BBlock<dg::LLVMNode>::BBlockEdge_const&>(local_78,&local_90);
            local_90.target = this;
            std::
            _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
            ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                      ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                        *)&pBVar4->prevBBs,&local_90.target);
          }
          std::
          _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
          ::_M_erase(&local_70,
                     (_Link_type)local_70._M_impl.super__Rb_tree_header._M_header._M_parent);
        }
      }
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != local_38);
  }
  if (pLVar12 != (LLVMBBlock *)0x0) {
    local_70._M_impl._0_8_ = pLVar12->key;
    local_90.target = pLVar12;
    std::
    _Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>,std::_Select1st<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>>
    ::_M_emplace_unique<llvm::Value*&,dg::BBlock<dg::LLVMNode>*&>
              ((_Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>,std::_Select1st<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::BBlock<dg::LLVMNode>*>>>
                *)(graph + 0x60),(Value **)&local_70,&local_90.target);
  }
  return;
}

Assistant:

static void adjustBBlocksSucessors(LLVMDependenceGraph *graph,
                                       uint32_t slice_id) {
        LLVMBBlock *oldExitBB = graph->getExitBB();
        assert(oldExitBB && "Don't have exit BB");

        LLVMBBlock *newExitBB = nullptr;

        for (auto &it : graph->getBlocks()) {
            const llvm::BasicBlock *llvmBB =
                    llvm::cast<llvm::BasicBlock>(it.first);
            const auto *const tinst = llvmBB->getTerminator();
            LLVMBBlock *BB = it.second;

            // nothing to do
            if (BB->successorsNum() == 0)
                continue;

            // if the BB has two successors and one is self-loop and
            // the branch inst is going to be removed, then the brach
            // that created the self-loop has no meaning to the sliced
            // program and this is going to be an unconditional jump
            // to the other branch
            // NOTE: do this before the next action, to rename the label if
            // needed
            if (BB->successorsNum() == 2 &&
                BB->getLastNode()->getSlice() != slice_id &&
                !BB->successorsAreSame() && BB->hasSuccessor(BB)) {
                bool found = BB->removeSuccessorsTarget(BB);
                // we have two different successors, none of them
                // is self-loop and we're slicing away the brach inst?
                // This should not happen...
                if (!found) {
                    assert(found && "Self loop did not have self loop...");
                    abort();
                }
                assert(BB->successorsNum() == 1 &&
                       "Should have only one successor");

                // continue here to rename the only label if needed
            }

            // if the BB has only one successor and the terminator
            // instruction is going to be sliced away, it means that
            // this is going to be an unconditional jump,
            // so just make the label 0
            if (BB->successorsNum() == 1 &&
                BB->getLastNode()->getSlice() != slice_id) {
                auto edge = *(BB->successors().begin());

                // modify the edge
                edge.label = 0;
                if (edge.target == oldExitBB) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

                    edge.target = newExitBB;
                }

                // replace the only edge
                BB->removeSuccessors();
                BB->addSuccessor(edge);

                continue;
            }

            // when we have more successors, we need to fill in
            // jumps under labels that we sliced away

            DGContainer<uint8_t> labels;
            // go through BBs successors and gather all labels
            // from edges that go from this BB. Also if there's
            // a jump to return block, replace it with new
            // return block
            for (const auto &succ : BB->successors()) {
                // skip artificial return basic block.
                if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL ||
                    succ.target == oldExitBB)
                    continue;

                labels.insert(succ.label);
            }

            // replace missing labels. Label should be from 0 to some max,
            // no gaps, so jump to safe exit under missing labels
            for (unsigned i = 0; i < tinst->getNumSuccessors(); ++i) {
                if (!labels.contains(i)) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

#ifndef NDEBUG
                    bool ret =
#endif
                            BB->addSuccessor(newExitBB, i);
                    assert(ret && "Already had this CFG edge, that is wrong");
                }
            }

            // this BB is going to be removed
            if (newExitBB)
                BB->removeSuccessorsTarget(oldExitBB);

            // if we have all successor edges pointing to the same
            // block, replace them with one successor (thus making
            // unconditional jump)
            if (BB->successorsNum() > 1 && BB->successorsAreSame()) {
                LLVMBBlock *succ = BB->successors().begin()->target;

                BB->removeSuccessors();
                BB->addSuccessor(succ, 0);
#ifdef NDEBUG
                assert(BB->successorsNum() == 1 &&
                       "BUG: in removeSuccessors() or addSuccessor()");
#endif
            }

#ifndef NDEBUG
            // check the BB
            labels.clear();
            for (const auto &succ : BB->successors()) {
                assert((!newExitBB || succ.target != oldExitBB) &&
                       "A block has the old BB as successor");
                // we can have more labels with different targets,
                // but we can not have one target with more labels
                assert(labels.insert(succ.label) && "Already have a label");
            }

            // check that we have all labels without any gep
            auto l = labels.begin();
            for (unsigned i = 0; i < labels.size(); ++i) {
                // set is ordered, so this must hold
                assert((*l == LLVMBBlock::MAX_BBLOCK_LABEL || i == *l++) &&
                       "Labels have a gap");
            }
#endif
        }

        if (newExitBB) {
            graph->addBlock(newExitBB->getKey(), newExitBB);
            assert(graph->getExitBB() == newExitBB);
            // NOTE: do not delete the old block
            // because it is the unified BB that is kept in
            // unique_ptr, so it will be deleted later automatically.
            // Deleting it would lead to double-free
        }
    }